

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

string * rcg::getEnum(string *__return_storage_ptr__,shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,
                     char *name,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *list,bool exception)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  ulong uVar4;
  gcstring *this;
  char *pcVar5;
  invalid_argument *piVar6;
  ulong uVar7;
  allocator local_c1;
  string *local_c0;
  StringList_t entries;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [2];
  char *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_c0 = __return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(list);
  peVar1 = (nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  GenICam_3_4::gcstring::gcstring((gcstring *)local_88,name);
  iVar2 = (*(peVar1->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar1,local_88);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  GenICam_3_4::gcstring::~gcstring((gcstring *)local_88);
  if (plVar3 == (long *)0x0) {
    if (exception) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_a8,"Feature not found: ",(allocator *)&entries);
      std::operator+(local_88,&local_a8,name);
      std::invalid_argument::invalid_argument(piVar6,(string *)local_88);
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    iVar2 = (*(code *)**(undefined8 **)((long)plVar3 + *(long *)(*plVar3 + -0x28)))
                      ((long)plVar3 + *(long *)(*plVar3 + -0x28));
    if (iVar2 - 3U < 2) {
      plVar3 = (long *)__dynamic_cast(plVar3,&GenApi_3_4::INode::typeinfo,
                                      &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe);
      if (plVar3 == (long *)0x0) {
        if (exception) {
          piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)&local_a8,"Feature not enumeration: ",(allocator *)&entries);
          std::operator+(local_88,&local_a8,name);
          std::invalid_argument::invalid_argument(piVar6,(string *)local_88);
          __cxa_throw(piVar6,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      else {
        GenICam_3_4::gcstring_vector::gcstring_vector(&entries);
        local_38 = name;
        (**(code **)(*plVar3 + 0x38))(plVar3,&entries);
        uVar7 = 0;
        while( true ) {
          uVar4 = GenICam_3_4::gcstring_vector::size();
          if (uVar4 <= uVar7) break;
          this = (gcstring *)GenICam_3_4::gcstring_vector::operator[]((ulong)&entries);
          pcVar5 = GenICam_3_4::gcstring::operator_cast_to_char_(this);
          std::__cxx11::string::string((string *)local_88,pcVar5,(allocator *)&local_a8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)list,
                     local_88);
          std::__cxx11::string::~string((string *)local_88);
          uVar7 = uVar7 + 1;
        }
        plVar3 = (long *)(**(code **)(*plVar3 + 0x78))(plVar3,0,0);
        if (plVar3 == (long *)0x0) {
          if (exception) {
            piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string
                      ((string *)&local_a8,"Current value is not defined: ",&local_c1);
            std::operator+(local_88,&local_a8,local_38);
            std::invalid_argument::invalid_argument(piVar6,(string *)local_88);
            __cxa_throw(piVar6,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
        }
        else {
          (**(code **)(*plVar3 + 0x40))(local_88,plVar3);
          GenICam_3_4::gcstring::operator_cast_to_char_((gcstring *)local_88);
          std::__cxx11::string::assign((char *)local_c0);
          GenICam_3_4::gcstring::~gcstring((gcstring *)local_88);
        }
        GenICam_3_4::gcstring_vector::~gcstring_vector(&entries);
      }
    }
    else if (exception) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_a8,"Feature not readable: ",(allocator *)&entries);
      std::operator+(local_88,&local_a8,name);
      std::invalid_argument::invalid_argument(piVar6,(string *)local_88);
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return local_c0;
}

Assistant:

std::string getEnum(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                    std::vector<std::string> &list, bool exception)
{
  std::string ret;

  list.clear();

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsReadable(node))
      {
        GenApi::IEnumeration *val=dynamic_cast<GenApi::IEnumeration *>(node);

        if (val != 0)
        {
          GenApi::StringList_t entries;
          val->GetSymbolics(entries);

          for (size_t i=0; i<entries.size(); i++)
          {
            list.push_back(std::string(entries[i]));
          }

          GenApi::IEnumEntry *entry=val->GetCurrentEntry();

          if (entry != 0)
          {
            ret=entry->GetSymbolic();
          }
          else if (exception)
          {
            throw std::invalid_argument(std::string("Current value is not defined: ")+name);
          }
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not enumeration: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not readable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}